

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codedump.c
# Opt level: O0

void dump_task_struct(task_struct *t)

{
  undefined8 uVar1;
  unsigned_long uVar2;
  undefined8 *in_RDI;
  
  printf("head  %#lx %#lx\n",*in_RDI,in_RDI[1]);
  printf("state  %#lx %#lx\n",in_RDI[4],in_RDI[5]);
  printf("pid  %#lx %#lx\n",in_RDI[6],in_RDI[7]);
  printf("children  %#lx %#lx\n",in_RDI[8],in_RDI[9]);
  printf("sibling  %#lx %#lx\n",in_RDI[10],in_RDI[0xb]);
  printf("comm  %#lx %#lx\n",in_RDI[0xc],in_RDI[0xd]);
  printf("real_parent  %#lx %#lx\n",in_RDI[0xe],in_RDI[0xf]);
  uVar1 = in_RDI[0x14];
  uVar2 = __phys_addr(in_RDI[0x14]);
  printf("children_next %#lx %#lx\n",uVar1,uVar2);
  uVar1 = in_RDI[0x15];
  uVar2 = __phys_addr(in_RDI[0x15]);
  printf("children_prev %#lx %#lx\n",uVar1,uVar2);
  uVar1 = in_RDI[0x16];
  uVar2 = __phys_addr(in_RDI[0x16]);
  printf("sibling_next %#lx %#lx\n",uVar1,uVar2);
  uVar1 = in_RDI[0x17];
  uVar2 = __phys_addr(in_RDI[0x17]);
  printf("sibling_prev %#lx %#lx\n",uVar1,uVar2);
  return;
}

Assistant:

void dump_task_struct(struct task_struct *t)
{
	print_task_value(t, head);
	print_task_value(t, state);
	print_task_value(t, pid);
	print_task_value(t, children);
	print_task_value(t, sibling);
	print_task_value(t, comm);
	print_task_value(t, real_parent);

	printf("children_next %#lx %#lx\n",
	       t->children_next, __phys_addr(t->children_next));
	printf("children_prev %#lx %#lx\n",
	       t->children_prev, __phys_addr(t->children_prev));
	printf("sibling_next %#lx %#lx\n",
	       t->sibling_next, __phys_addr(t->sibling_next));
	printf("sibling_prev %#lx %#lx\n",
	       t->sibling_prev, __phys_addr(t->sibling_prev));
}